

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

void icu_63::calcGroupNameSetsLengths(int32_t maxNameLength)

{
  int32_t iVar1;
  uint8_t *lineLimit_00;
  int local_f0;
  int32_t length;
  int32_t lineNumber;
  int32_t groupCount;
  uint8_t *lineLimit;
  uint8_t *line;
  uint8_t *s;
  uint16_t *group;
  int8_t *tokenLengths;
  uint8_t *tokenStrings;
  uint16_t *puStack_b0;
  uint16_t tokenCount;
  uint16_t *tokens;
  uint16_t lengths [34];
  uint16_t local_58 [4];
  uint16_t offsets [34];
  int32_t local_c;
  int32_t maxNameLength_local;
  
  puStack_b0 = (uint16_t *)((long)uCharNames + 0x12);
  tokenStrings._6_2_ = (ushort)uCharNames[4];
  tokenLengths = (int8_t *)((long)uCharNames + (ulong)*uCharNames);
  group = (uint16_t *)uprv_malloc_63((ulong)tokenStrings._6_2_);
  if (group != (uint16_t *)0x0) {
    memset(group,0,(ulong)tokenStrings._6_2_);
  }
  s = (uint8_t *)((ushort *)((long)uCharNames + (ulong)uCharNames[1]) + 1);
  local_c = maxNameLength;
  for (length = (int32_t)*(ushort *)((long)uCharNames + (ulong)uCharNames[1]); 0 < length;
      length = length + -1) {
    line = (uint8_t *)
           ((long)uCharNames +
           (long)CONCAT22(*(undefined2 *)(s + 2),*(undefined2 *)(s + 4)) + (ulong)uCharNames[2]);
    line = expandGroupLengths(line,local_58,(uint16_t *)&tokens);
    for (local_f0 = 0; local_f0 < 0x20; local_f0 = local_f0 + 1) {
      lineLimit = line + (int)(uint)offsets[(long)local_f0 + -4];
      if (lengths[(long)local_f0 + -4] != 0) {
        lineLimit_00 = lineLimit + (int)(uint)lengths[(long)local_f0 + -4];
        iVar1 = calcNameSetLength(puStack_b0,tokenStrings._6_2_,(uint8_t *)tokenLengths,
                                  (int8_t *)group,(uint32_t *)gNameSet,&lineLimit,lineLimit_00);
        if (local_c < iVar1) {
          local_c = iVar1;
        }
        if ((lineLimit != lineLimit_00) &&
           (iVar1 = calcNameSetLength(puStack_b0,tokenStrings._6_2_,(uint8_t *)tokenLengths,
                                      (int8_t *)group,(uint32_t *)gNameSet,&lineLimit,lineLimit_00),
           local_c < iVar1)) {
          local_c = iVar1;
        }
      }
    }
    s = s + 6;
  }
  if (group != (uint16_t *)0x0) {
    uprv_free_63(group);
  }
  gMaxNameLength = local_c;
  return;
}

Assistant:

static void
calcGroupNameSetsLengths(int32_t maxNameLength) {
    uint16_t offsets[LINES_PER_GROUP+2], lengths[LINES_PER_GROUP+2];

    uint16_t *tokens=(uint16_t *)uCharNames+8;
    uint16_t tokenCount=*tokens++;
    uint8_t *tokenStrings=(uint8_t *)uCharNames+uCharNames->tokenStringOffset;

    int8_t *tokenLengths;

    const uint16_t *group;
    const uint8_t *s, *line, *lineLimit;

    int32_t groupCount, lineNumber, length;

    tokenLengths=(int8_t *)uprv_malloc(tokenCount);
    if(tokenLengths!=NULL) {
        uprv_memset(tokenLengths, 0, tokenCount);
    }

    group=GET_GROUPS(uCharNames);
    groupCount=*group++;

    /* enumerate all groups */
    while(groupCount>0) {
        s=(uint8_t *)uCharNames+uCharNames->groupStringOffset+GET_GROUP_OFFSET(group);
        s=expandGroupLengths(s, offsets, lengths);

        /* enumerate all lines in each group */
        for(lineNumber=0; lineNumber<LINES_PER_GROUP; ++lineNumber) {
            line=s+offsets[lineNumber];
            length=lengths[lineNumber];
            if(length==0) {
                continue;
            }

            lineLimit=line+length;

            /* read regular name */
            length=calcNameSetLength(tokens, tokenCount, tokenStrings, tokenLengths, gNameSet, &line, lineLimit);
            if(length>maxNameLength) {
                maxNameLength=length;
            }
            if(line==lineLimit) {
                continue;
            }

            /* read Unicode 1.0 name */
            length=calcNameSetLength(tokens, tokenCount, tokenStrings, tokenLengths, gNameSet, &line, lineLimit);
            if(length>maxNameLength) {
                maxNameLength=length;
            }
            if(line==lineLimit) {
                continue;
            }

            /* read ISO comment */
            /*length=calcNameSetLength(tokens, tokenCount, tokenStrings, tokenLengths, gISOCommentSet, &line, lineLimit);*/
        }

        group=NEXT_GROUP(group);
        --groupCount;
    }

    if(tokenLengths!=NULL) {
        uprv_free(tokenLengths);
    }

    /* set gMax... - name length last for threading */
    gMaxNameLength=maxNameLength;
}